

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_bpf2_get_heap_size(ma_bpf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ulong uVar2;
  double __x;
  
  __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
  sin(__x);
  sin(1.5707963267948966 - __x);
  if (pHeapSizeInBytes == (size_t *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    uVar2 = (ulong)pConfig->channels;
    *pHeapSizeInBytes = 0;
    if (uVar2 == 0) {
      mVar1 = (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
    }
    else {
      *pHeapSizeInBytes = uVar2 << 3;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_bpf2_get_heap_size(const ma_bpf2_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_biquad_config bqConfig;
    bqConfig = ma_bpf2__get_biquad_config(pConfig);

    return ma_biquad_get_heap_size(&bqConfig, pHeapSizeInBytes);
}